

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O3

void __thiscall MercuryJson::JSON::exec_stage2(JSON *this)

{
  JsonValue *pJVar1;
  long lVar2;
  thread parse_str_threads [4];
  unsigned_long local_80;
  JSON *local_78;
  thread local_70;
  long local_68 [5];
  code *local_40;
  undefined8 local_38;
  
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_80 = 0;
  do {
    local_40 = _thread_parse_str;
    local_38 = 0;
    local_78 = this;
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long),MercuryJson::JSON*,unsigned_long&,void>
              (&local_70,(offset_in_JSON_to_subr *)&local_40,&local_78,&local_80);
    if (local_68[local_80] != 0) goto LAB_0010e73a;
    ((id *)(local_68 + local_80))->_M_thread = (native_handle_type)local_70._M_id._M_thread;
    local_80 = local_80 + 1;
  } while (local_80 < 4);
  pJVar1 = _parse_value(this);
  this->document = pJVar1;
  if (this->input[*this->idx_ptr] != '\0') {
    _error(this,"file end",this->input[*this->idx_ptr],*this->idx_ptr);
  }
  lVar2 = 0;
  do {
    std::thread::join();
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  if (this->indices != (size_t *)0x0) {
    free(this->indices);
  }
  lVar2 = 0x20;
  this->indices = (size_t *)0x0;
  while (*(long *)((long)local_68 + lVar2 + -8) == 0) {
    lVar2 = lVar2 + -8;
    if (lVar2 == 0) {
      return;
    }
  }
LAB_0010e73a:
  std::terminate();
}

Assistant:

void JSON::exec_stage2() {
//        std::chrono::time_point<std::chrono::steady_clock> start_time;
//        std::chrono::duration<double> runtime;
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        std::thread parse_str_threads[PARSE_STR_NUM_THREADS];
        for (size_t i = 0; i < PARSE_STR_NUM_THREADS; ++i)
            parse_str_threads[i] = std::thread(&JSON::_thread_parse_str, this, i);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("thread spawn: %.6lf\n", runtime.count());
#endif

//        start_time = std::chrono::steady_clock::now();
#if SHIFT_REDUCE_PARSER
        document = _shift_reduce_parsing();  // final index is '\0'
#else
        document = _parse_value();
#endif
        char ch = input[*idx_ptr];
        if (ch != '\0') _error("file end", ch, *idx_ptr);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("parse document: %.6lf\n", runtime.count());
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        for (std::thread &thread : parse_str_threads)
            thread.join();
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("wait join: %.6lf\n", runtime.count());
#endif
        aligned_free(indices);
        indices = nullptr;
    }